

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O2

uint32_t cpu_ldl_data_ra_sparc64(CPUArchState_conflict19 *env,target_ulong ptr,uintptr_t retaddr)

{
  int mmu_idx;
  uint32_t uVar1;
  
  mmu_idx = cpu_mmu_index((CPUSPARCState_conflict1 *)env,false);
  uVar1 = cpu_ldl_mmuidx_ra_sparc64(env,ptr,mmu_idx,retaddr);
  return uVar1;
}

Assistant:

uint32_t cpu_ldl_data_ra(CPUArchState *env, target_ulong ptr, uintptr_t retaddr)
{
    return cpu_ldl_mmuidx_ra(env, ptr, cpu_mmu_index(env, false), retaddr);
}